

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::internalCompile(SelectionCompiler *this)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  TokenMap *this_00;
  Token *pTVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  bool local_101;
  Token token;
  string str;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> ltoken;
  Token local_70;
  Token tokenCommand;
  any local_40;
  
  this->cchScript = (int)(this->script)._M_string_length;
  this->ichToken = 0;
  psVar1 = &this->script;
  this->lineCurrent = 1;
  this->error = false;
  std::
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ::clear(&this->aatokenCompiled);
  ltoken.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ltoken.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ltoken.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tokenCommand.tok = 5;
  tokenCommand._4_8_ = 0;
  tokenCommand.value._4_8_ = 0;
  tokenCommand.value._M_storage._4_4_ = 0;
  iVar7 = 0;
  do {
    bVar2 = lookingAtLeadingWhitespace(this);
    if (!bVar2) {
      bVar2 = lookingAtEndOfLine(this);
      if ((bVar2) || (bVar3 = lookingAtEndOfStatement(this), bVar3)) {
        if (iVar7 != 0) {
          bVar3 = compileCommand(this,&ltoken);
          if (!bVar3) {
            bVar5 = 0;
            goto LAB_0022f3c9;
          }
          std::
          vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
          ::push_back(&this->aatokenCompiled,&this->atokenCommand);
          str._M_dataplus._M_p._0_4_ = (int)this->lineCurrent;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->lineNumbers,(int *)&str);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->lineIndices,&this->ichCurrentCommand);
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::clear(&ltoken);
        }
        bVar3 = this->ichToken < this->cchScript;
        if (bVar2 && bVar3) {
          this->lineCurrent = this->lineCurrent + 1;
          iVar7 = 0;
          goto LAB_0022f3a6;
        }
        cVar6 = bVar3 * '\x02' + '\x02';
        iVar7 = 0;
      }
      else {
        if (iVar7 != 0) {
          bVar2 = lookingAtString(this);
          if (bVar2) {
            getUnescapedStringLiteral_abi_cxx11_(&str,this);
            std::any::
            any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                      ((any *)&local_70,&str);
            Token::Token(&token,4,(any *)&local_70);
            std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::emplace_back<OpenMD::Token>
                      (&ltoken,&token);
            std::any::reset(&token.value);
            std::any::reset((any *)&local_70);
            std::__cxx11::string::~string((string *)&str);
          }
          else {
            bVar2 = lookingAtDecimal(this,false);
            if (bVar2) {
              std::__cxx11::string::substr((ulong)&str,(ulong)psVar1);
              fVar9 = lexi_cast<float>(&str);
              std::__cxx11::string::~string((string *)&str);
              token.tok = 0x21e7aa;
              token.intValue = 0;
              token.value._M_manager._4_4_ = 0;
              token.value._M_manager._0_4_ = fVar9;
              Token::Token((Token *)&str,3,(any *)&token);
              std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::
              emplace_back<OpenMD::Token>(&ltoken,(Token *)&str);
            }
            else {
              bVar2 = lookingAtInteger(this,true);
              if (!bVar2) goto LAB_0022f1e5;
              std::__cxx11::string::substr((ulong)&str,(ulong)psVar1);
              fVar9 = (float)lexi_cast<int>(&str);
              std::__cxx11::string::~string((string *)&str);
              token.tok = 0x21e870;
              token.intValue = 0;
              token.value._M_manager._4_4_ = 0;
              token.value._M_manager._0_4_ = fVar9;
              Token::Token((Token *)&str,2,(any *)&token);
              std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::
              emplace_back<OpenMD::Token>(&ltoken,(Token *)&str);
            }
            std::any::reset((any *)&str._M_string_length);
            std::any::reset((any *)&token);
          }
          goto LAB_0022f3a6;
        }
LAB_0022f1e5:
        bVar2 = lookingAtLookupToken(this);
        if (!bVar2) {
          if (ltoken.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
              super__Vector_impl_data._M_start ==
              ltoken.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_101 = commandExpected(this);
          }
          else {
            local_101 = unrecognizedToken(this);
          }
          goto LAB_0022f3c3;
        }
        std::__cxx11::string::substr((ulong)&str,(ulong)psVar1);
        token.tok = 5;
        token.intValue = 0;
        token.value._M_manager._0_4_ = 0.0;
        token.value._M_manager._4_4_ = 0;
        token.value._M_storage._0_4_ = 0;
        token.value._M_storage._4_4_ = 0;
        this_00 = TokenMap::getInstance();
        pTVar4 = TokenMap::getToken(this_00,&str);
        if (pTVar4 == (Token *)0x0) {
          std::any::
          any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                    (&local_40,&str);
          Token::Token(&local_70,1,&local_40);
          Token::operator=(&token,&local_70);
          std::any::reset(&local_70.value);
          std::any::reset(&local_40);
        }
        else {
          Token::operator=(&token,pTVar4);
        }
        iVar8 = token.tok;
        if (iVar7 == 0x302) {
          iVar7 = 0x302;
          if (((uint)token.tok >> 10 & 1) != 0 || token.tok == 1) goto LAB_0022f377;
          local_101 = invalidExpressionToken(this,&str);
          iVar8 = 0x302;
LAB_0022f36e:
          cVar6 = '\x01';
          iVar7 = iVar8;
        }
        else {
          if (iVar7 == 0x301) {
            if ((long)ltoken.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)ltoken.super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                      _M_impl.super__Vector_impl_data._M_start == 0x18) {
              iVar7 = 0x301;
              if ((token.tok & 0x4400U) != 0x4400 && token.tok != 1) {
LAB_0022f359:
                local_101 = invalidExpressionToken(this,&str);
                iVar8 = 0x301;
                goto LAB_0022f36e;
              }
            }
            else {
              iVar7 = 0x301;
              if ((token.tok & 0x4400U) == 0 && token.tok != 1) goto LAB_0022f359;
            }
          }
          else if ((iVar7 == 0) &&
                  (this->ichCurrentCommand = this->ichToken, iVar7 = token.tok,
                  ((uint)token.tok >> 8 & 1) == 0)) {
            local_101 = commandExpected(this);
            goto LAB_0022f36e;
          }
LAB_0022f377:
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back(&ltoken,&token);
          cVar6 = '\x04';
        }
        std::any::reset(&token.value);
        std::__cxx11::string::~string((string *)&str);
      }
      if (cVar6 != '\x04') {
        bVar5 = 1;
        if (cVar6 != '\x02') {
LAB_0022f3c3:
          bVar5 = local_101;
        }
LAB_0022f3c9:
        std::any::reset(&tokenCommand.value);
        std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(&ltoken);
        return (bool)(bVar5 & 1);
      }
    }
LAB_0022f3a6:
    this->ichToken = this->ichToken + this->cchToken;
  } while( true );
}

Assistant:

bool SelectionCompiler::internalCompile() {
    cchScript   = script.size();
    ichToken    = 0;
    lineCurrent = 1;

    error = false;

    // std::vector<Token> lltoken;
    aatokenCompiled.clear();
    std::vector<Token> ltoken;

    Token tokenCommand;
    int tokCommand = Token::nada;

    for (; true; ichToken += cchToken) {
      if (lookingAtLeadingWhitespace()) continue;
      // if (lookingAtComment())
      //    continue;
      bool endOfLine = lookingAtEndOfLine();
      if (endOfLine || lookingAtEndOfStatement()) {
        if (tokCommand != Token::nada) {
          if (!compileCommand(ltoken)) { return false; }
          aatokenCompiled.push_back(atokenCommand);
          lineNumbers.push_back(lineCurrent);
          lineIndices.push_back(ichCurrentCommand);
          ltoken.clear();
          tokCommand = Token::nada;
        }

        if (ichToken < cchScript) {
          if (endOfLine) ++lineCurrent;
          continue;
        }
        break;
      }

      if (tokCommand != Token::nada) {
        if (lookingAtString()) {
          std::string str = getUnescapedStringLiteral();
          ltoken.push_back(Token(Token::string, str));
          continue;
        }
        // if ((tokCommand & Token::specialstring) != 0 &&
        //    lookingAtSpecialString()) {
        //    std::string str = script.substr(ichToken, ichToken + cchToken);
        //    ltoken.push_back(Token(Token::string, str));
        //    continue;
        //}
        // if (lookingAtDecimal((tokCommand & Token::negnums) != 0)) {
        if (lookingAtDecimal((tokCommand) != 0)) {
          float value = lexi_cast<float>(script.substr(ichToken, cchToken));
          ltoken.push_back(Token(Token::decimal, std::any(value)));
          continue;
        }
        // if (lookingAtInteger((tokCommand & Token::negnums) != 0)) {
        if (lookingAtInteger((tokCommand) != 0)) {
          int val = lexi_cast<int>(script.substr(ichToken, cchToken));
          ltoken.push_back(Token(Token::integer, std::any(val)));
          continue;
        }
      }

      if (lookingAtLookupToken()) {
        std::string ident = script.substr(ichToken, cchToken);
        Token token;
        Token* pToken = TokenMap::getInstance().getToken(ident);
        if (pToken != NULL) {
          token = *pToken;
        } else {
          token = Token(Token::identifier, ident);
        }

        int tok = token.tok;

        switch (tokCommand) {
        case Token::nada:
          ichCurrentCommand = ichToken;
          // tokenCommand = token;
          tokCommand = tok;
          if ((tokCommand & Token::command) == 0) return commandExpected();
          break;

        case Token::define:
          if (ltoken.size() == 1) {
            // we are looking at the variable name
            if (tok != Token::identifier &&
                (tok & Token::predefinedset) != Token::predefinedset)
              return invalidExpressionToken(ident);
          } else {
            // we are looking at the expression
            if (tok != Token::identifier &&
                (tok & (Token::expression | Token::predefinedset)) == 0)
              return invalidExpressionToken(ident);
          }

          break;

        case Token::select:
          if (tok != Token::identifier && (tok & Token::expression) == 0)
            return invalidExpressionToken(ident);
          break;
        }
        ltoken.push_back(token);
        continue;
      }

      if (ltoken.empty()) { return commandExpected(); }

      return unrecognizedToken();
    }

    return true;
  }